

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O0

void __thiscall QSqlQueryModel::clear(QSqlQueryModel *this)

{
  QSqlQueryModelPrivate *nativeErrorCode;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QSqlQueryModelPrivate *d;
  QSqlError *other;
  QSqlQueryModel *in_stack_ffffffffffffff60;
  QList<QHash<int,_QVariant>_> *this_00;
  ErrorType type;
  QString *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QAbstractItemModel *in_stack_ffffffffffffffa0;
  QList<QHash<int,_QVariant>_> local_58 [3];
  QSqlError local_10;
  long local_8;
  
  type = (ErrorType)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  nativeErrorCode = d_func((QSqlQueryModel *)0x150a10);
  beginResetModel(in_stack_ffffffffffffff60);
  QString::QString((QString *)0x150a31);
  QString::QString((QString *)0x150a40);
  this_00 = local_58;
  QString::QString((QString *)0x150a4f);
  other = &local_10;
  QSqlError::QSqlError
            ((QSqlError *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,type,(QString *)nativeErrorCode);
  QSqlError::operator=((QSqlError *)this_00,other);
  QSqlError::~QSqlError((QSqlError *)0x150a8f);
  QString::~QString((QString *)0x150a99);
  QString::~QString((QString *)0x150aa3);
  QString::~QString((QString *)0x150aad);
  nativeErrorCode->field_0x108 = nativeErrorCode->field_0x108 | 1;
  QSqlQuery::clear((QSqlQuery *)this_00);
  QSqlRecord::clear((QSqlRecord *)this_00);
  QVLABase<int>::clear(&(nativeErrorCode->colOffsets).super_QVLABase<int>);
  QModelIndex::QModelIndex((QModelIndex *)0x150afe);
  (nativeErrorCode->bottom).m.ptr = in_stack_ffffffffffffffa0;
  *(QString **)&nativeErrorCode->bottom = in_stack_ffffffffffffff90;
  (nativeErrorCode->bottom).i = (quintptr)in_stack_ffffffffffffff98;
  QList<QHash<int,_QVariant>_>::clear(this_00);
  endResetModel((QSqlQueryModel *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlQueryModel::clear()
{
    Q_D(QSqlQueryModel);
    beginResetModel();
    d->error = QSqlError();
    d->atEnd = true;
    d->query.clear();
    d->rec.clear();
    d->colOffsets.clear();
    d->bottom = QModelIndex();
    d->headers.clear();
    endResetModel();
}